

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall
dmlc::JSONObjectReadHelper::ReadAllFields(JSONObjectReadHelper *this,JSONReader *reader)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  size_type sVar5;
  pointer ppVar6;
  ostringstream *poVar7;
  ostream *poVar8;
  string local_5d8;
  LogMessageFatal local_5b8;
  uint local_42c;
  size_type local_428;
  LogCheckError local_420;
  LogCheckError _check_err;
  _Self local_410;
  iterator it_1;
  LogMessageFatal local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  _Self local_240;
  _Self local_238;
  iterator it;
  ostringstream local_210 [8];
  ostringstream err;
  Entry e;
  undefined1 local_68 [8];
  string key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  visited;
  JSONReader *reader_local;
  JSONObjectReadHelper *this_local;
  
  JSONReader::BeginObject(reader);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)((long)&key.field_2 + 8));
  std::__cxx11::string::string((string *)local_68);
  while (bVar1 = JSONReader::NextObjectItem(reader,(string *)local_68), bVar1) {
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
            ::count(&this->map_,(key_type *)local_68);
    if (sVar5 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_210);
      (anonymous_namespace)::Extend<char_const*>((ostream *)local_210,"JSONReader: Unknown field ");
      std::__cxx11::string::string((string *)&it,(string *)local_68);
      (anonymous_namespace)::Extend<std::__cxx11::string>
                ((ostream *)local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
      std::__cxx11::string::~string((string *)&it);
      (anonymous_namespace)::Extend<char_const*>((ostream *)local_210,", candidates are: \n");
      local_238._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
           ::begin(&this->map_);
      while( true ) {
        local_240._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
             ::end(&this->map_);
        bVar1 = std::operator!=(&local_238,&local_240);
        if (!bVar1) break;
        anon_unknown_9::Extend<char>((ostream *)local_210,'\"');
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>
                 ::operator->(&local_238);
        std::__cxx11::string::string((string *)&local_260,(string *)ppVar6);
        (anonymous_namespace)::Extend<std::__cxx11::string>((ostream *)local_210,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        (anonymous_namespace)::Extend<char_const*>((ostream *)local_210,"\"\n");
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>
        ::operator++(&local_238);
      }
      LogMessageFatal::LogMessageFatal
                (&local_3e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x3d3);
      poVar7 = LogMessageFatal::stream_abi_cxx11_(&local_3e8);
      std::__cxx11::ostringstream::str();
      std::operator<<((ostream *)poVar7,(string *)&it_1);
      std::__cxx11::string::~string((string *)&it_1);
      LogMessageFatal::~LogMessageFatal(&local_3e8);
      std::__cxx11::ostringstream::~ostringstream(local_210);
    }
    else {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
               ::operator[](&this->map_,(key_type *)local_68);
      (*pmVar2->func)(reader,pmVar2->addr);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)((long)&key.field_2 + 8),(key_type *)local_68);
      *pmVar3 = 0;
    }
  }
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)((long)&key.field_2 + 8));
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
          ::size(&this->map_);
  if (sVar4 != sVar5) {
    local_410._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
         ::begin(&this->map_);
    while( true ) {
      _check_err.str =
           (string *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
           ::end(&this->map_);
      bVar1 = std::operator!=(&local_410,(_Self *)&_check_err);
      if (!bVar1) break;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>
               ::operator->(&local_410);
      if (((ppVar6->second).optional & 1U) == 0) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>
                 ::operator->(&local_410);
        local_428 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)((long)&key.field_2 + 8),&ppVar6->first);
        local_42c = 0;
        LogCheck_NE<unsigned_long,unsigned_int>((dmlc *)&local_420,&local_428,&local_42c);
        bVar1 = LogCheckError::operator_cast_to_bool(&local_420);
        if (bVar1) {
          LogMessageFatal::LogMessageFatal
                    (&local_5b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                     ,0x3df);
          poVar7 = LogMessageFatal::stream_abi_cxx11_(&local_5b8);
          poVar8 = std::operator<<((ostream *)poVar7,"Check failed: ");
          poVar8 = std::operator<<(poVar8,"visited.count(it->first) != 0U");
          poVar8 = std::operator<<(poVar8,(string *)local_420.str);
          poVar8 = std::operator<<(poVar8,": ");
          poVar8 = std::operator<<(poVar8,"JSONReader: Missing field \"");
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>
                   ::operator->(&local_410);
          poVar8 = std::operator<<(poVar8,(string *)ppVar6);
          poVar8 = std::operator<<(poVar8,"\"\n At ");
          JSONReader::line_info_abi_cxx11_(&local_5d8,reader);
          std::operator<<(poVar8,(string *)&local_5d8);
          std::__cxx11::string::~string((string *)&local_5d8);
          LogMessageFatal::~LogMessageFatal(&local_5b8);
        }
        LogCheckError::~LogCheckError(&local_420);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>
      ::operator++(&local_410);
    }
  }
  std::__cxx11::string::~string((string *)local_68);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)((long)&key.field_2 + 8));
  return;
}

Assistant:

inline void JSONObjectReadHelper::ReadAllFields(JSONReader *reader) {
  reader->BeginObject();
  std::map<std::string, int> visited;
  std::string key;
  while (reader->NextObjectItem(&key)) {
    if (map_.count(key) != 0) {
      Entry e = map_[key];
      (*e.func)(reader, e.addr);
      visited[key] = 0;
    } else {
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
      std::ostringstream err;
#else
      std::string err("");
#endif
      Extend(&err, "JSONReader: Unknown field ");
      Extend(&err, key);
      Extend(&err, ", candidates are: \n");
      for (std::map<std::string, Entry>::iterator
               it = map_.begin();
           it != map_.end(); ++it) {
        Extend(&err, '\"');
        Extend(&err, it->first);
        Extend(&err, "\"\n");
      }
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
      LOG(FATAL) << err.str();
#else
      LOG(FATAL) << err;
#endif
    }
  }
  if (visited.size() != map_.size()) {
    for (std::map<std::string, Entry>::iterator
             it = map_.begin();
         it != map_.end(); ++it) {
      if (it->second.optional)
        continue;
      CHECK_NE(visited.count(it->first), 0U)
          << "JSONReader: Missing field \"" << it->first << "\"\n At "
          << reader->line_info();
    }
  }
}